

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfiledevice.cpp
# Opt level: O1

qint64 __thiscall QFileDevice::writeData(QFileDevice *this,char *data,qint64 len)

{
  QFileDevicePrivate *this_00;
  QRingBuffer *pQVar1;
  QAbstractFileEngine *pQVar2;
  bool bVar3;
  int iVar4;
  FileError FVar5;
  qint64 qVar6;
  int extraout_var;
  QFileDevicePrivate *d;
  FileError FVar7;
  long in_FS_OFFSET;
  QString local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (QFileDevicePrivate *)
            (this->super_QIODevice).d_ptr._M_t.
            super___uniq_ptr_impl<QIODevicePrivate,_std::default_delete<QIODevicePrivate>_>._M_t.
            super__Tuple_impl<0UL,_QIODevicePrivate_*,_std::default_delete<QIODevicePrivate>_>.
            super__Head_base<0UL,_QIODevicePrivate_*,_false>._M_head_impl;
  QFileDevicePrivate::setError(this_00,NoError);
  this_00->lastWasWrite = true;
  if ((*(byte *)&(this_00->super_QIODevicePrivate).openMode.
                 super_QFlagsStorageHelper<QIODeviceBase::OpenModeFlag,_4> & 0x20) == 0) {
    pQVar1 = (this_00->super_QIODevicePrivate).writeBuffer.m_buf;
    if (pQVar1 == (QRingBuffer *)0x0) {
      qVar6 = 0;
    }
    else {
      qVar6 = pQVar1->bufferSize;
    }
    if ((long)(this_00->super_QIODevicePrivate).writeBufferChunkSize < qVar6 + len) {
      bVar3 = flush(this);
      qVar6 = -1;
      if (!bVar3) goto LAB_0010e0e5;
    }
    if (len <= (this_00->super_QIODevicePrivate).writeBufferChunkSize) {
      QRingBuffer::append((this_00->super_QIODevicePrivate).writeBuffer.m_buf,data,len);
      qVar6 = len;
      goto LAB_0010e0e5;
    }
  }
  pQVar2 = (this_00->fileEngine)._M_t.
           super___uniq_ptr_impl<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_>.
           _M_t.
           super__Tuple_impl<0UL,_QAbstractFileEngine_*,_std::default_delete<QAbstractFileEngine>_>.
           super__Head_base<0UL,_QAbstractFileEngine_*,_false>._M_head_impl;
  iVar4 = (*pQVar2->_vptr_QAbstractFileEngine[0x25])(pQVar2,data,len);
  qVar6 = CONCAT44(extraout_var,iVar4);
  if (extraout_var < 0) {
    FVar5 = QAbstractFileEngine::error
                      ((this_00->fileEngine)._M_t.
                       super___uniq_ptr_impl<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_QAbstractFileEngine_*,_std::default_delete<QAbstractFileEngine>_>
                       .super__Head_base<0UL,_QAbstractFileEngine_*,_false>._M_head_impl);
    FVar7 = WriteError;
    if (FVar5 != UnspecifiedError) {
      FVar7 = FVar5;
    }
    QAbstractFileEngine::errorString
              (&local_48,
               (this_00->fileEngine)._M_t.
               super___uniq_ptr_impl<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_>
               ._M_t.
               super__Tuple_impl<0UL,_QAbstractFileEngine_*,_std::default_delete<QAbstractFileEngine>_>
               .super__Head_base<0UL,_QAbstractFileEngine_*,_false>._M_head_impl);
    ((FileHandleFlags *)&this_00->error)->super_QFlagsStorageHelper<QFileDevice::FileHandleFlag,_4>
         = (QFlagsStorageHelper<QFileDevice::FileHandleFlag,_4>)FVar7;
    QString::operator=(&(this_00->super_QIODevicePrivate).errorString,&local_48);
    if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
LAB_0010e0e5:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return qVar6;
  }
  __stack_chk_fail();
}

Assistant:

qint64 QFileDevice::writeData(const char *data, qint64 len)
{
    Q_D(QFileDevice);
    unsetError();
    d->lastWasWrite = true;
    bool buffered = !(d->openMode & Unbuffered);

    // Flush buffered data if this read will overflow.
    if (buffered && (d->writeBuffer.size() + len) > d->writeBufferChunkSize) {
        if (!flush())
            return -1;
    }

    // Write directly to the engine if the block size is larger than
    // the write buffer size.
    if (!buffered || len > d->writeBufferChunkSize) {
        const qint64 ret = d->fileEngine->write(data, len);
        if (ret < 0) {
            QFileDevice::FileError err = d->fileEngine->error();
            if (err == QFileDevice::UnspecifiedError)
                err = QFileDevice::WriteError;
            d->setError(err, d->fileEngine->errorString());
        }
        return ret;
    }

    // Write to the buffer.
    d->writeBuffer.append(data, len);
    return len;
}